

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2OctalTests(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_4058;
  LogMessage local_3ed8;
  Arg local_3d58;
  RE2 local_3d48;
  StringPiece local_3c68;
  LogMessage local_3c58;
  LogMessage local_3ad8;
  Arg local_3958;
  RE2 local_3948;
  StringPiece local_3868;
  unsigned_long_long local_3858;
  unsigned_long_long v_7;
  LogMessage local_36d0;
  Arg local_3550;
  RE2 local_3540;
  StringPiece local_3460;
  LogMessage local_3450;
  LogMessage local_32d0;
  Arg local_3150;
  RE2 local_3140;
  StringPiece local_3060;
  long local_3050;
  longlong v_6;
  LogMessage local_2ec8;
  Arg local_2d48;
  RE2 local_2d38;
  StringPiece local_2c58;
  LogMessage local_2c48;
  LogMessage local_2ac8;
  Arg local_2948;
  RE2 local_2938;
  StringPiece local_2858;
  unsigned_long local_2848;
  unsigned_long v_5;
  LogMessage local_26c0;
  Arg local_2540;
  RE2 local_2530;
  StringPiece local_2450;
  LogMessage local_2440;
  LogMessage local_22c0;
  Arg local_2140;
  RE2 local_2130;
  StringPiece local_2050;
  long local_2040;
  long v_4;
  LogMessage local_1eb8;
  Arg local_1d38;
  RE2 local_1d28;
  StringPiece local_1c48;
  LogMessage local_1c38;
  LogMessage local_1ab8;
  Arg local_1938;
  RE2 local_1928;
  StringPiece local_1848;
  uint local_1834;
  undefined1 local_1830 [4];
  uint v_3;
  LogMessage local_16b0;
  Arg local_1530;
  RE2 local_1520;
  StringPiece local_1440;
  LogMessage local_1430;
  LogMessage local_12b0;
  Arg local_1130;
  RE2 local_1120;
  StringPiece local_1040;
  int local_102c;
  undefined1 local_1028 [4];
  int v_2;
  LogMessage local_ea8;
  Arg local_d28;
  RE2 local_d18;
  StringPiece local_c38;
  LogMessage local_c28;
  LogMessage local_aa8;
  Arg local_928;
  RE2 local_918;
  StringPiece local_838;
  unsigned_short local_822;
  undefined1 local_820 [6];
  unsigned_short v_1;
  LogMessage local_6a0;
  Arg local_520;
  RE2 local_510;
  StringPiece local_430;
  LogMessage local_420;
  LogMessage local_2a0;
  Arg local_110;
  RE2 local_100;
  StringPiece local_20;
  short local_a [4];
  short v;
  
  StringPiece::StringPiece(&local_20,"77777");
  RE2::RE2(&local_100,"([0-7]+)[uUlL]*");
  local_110 = RE2::Octal(local_a);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_20,&local_100,&local_110);
  RE2::~RE2(&local_100);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b);
    poVar2 = LogMessage::stream(&local_2a0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"77777\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a0);
  }
  if (local_a[0] != 0x7fff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_420,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b);
    poVar2 = LogMessage::stream(&local_420);
    std::operator<<(poVar2,"Check failed: (v) == (077777)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_420);
  }
  StringPiece::StringPiece(&local_430,"077777");
  RE2::RE2(&local_510,"([0-9a-fA-FxX]+)[uUlL]*");
  local_520 = RE2::CRadix(local_a);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_430,&local_510,&local_520);
  RE2::~RE2(&local_510);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b);
    poVar2 = LogMessage::stream(&local_6a0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"77777\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6a0);
  }
  if (local_a[0] != 0x7fff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_820,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3b);
    poVar2 = LogMessage::stream((LogMessage *)local_820);
    std::operator<<(poVar2,"Check failed: (v) == (077777)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_820);
  }
  StringPiece::StringPiece(&local_838,"177777U");
  RE2::RE2(&local_918,"([0-7]+)[uUlL]*");
  local_928 = RE2::Octal(&local_822);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_838,&local_918,&local_928);
  RE2::~RE2(&local_918);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_aa8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c);
    poVar2 = LogMessage::stream(&local_aa8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"177777U\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_aa8);
  }
  if (local_822 != 0xffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c28,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c);
    poVar2 = LogMessage::stream(&local_c28);
    std::operator<<(poVar2,"Check failed: (v) == (0177777U)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c28);
  }
  StringPiece::StringPiece(&local_c38,"0177777U");
  RE2::RE2(&local_d18,"([0-9a-fA-FxX]+)[uUlL]*");
  local_d28 = RE2::CRadix(&local_822);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_c38,&local_d18,&local_d28);
  RE2::~RE2(&local_d18);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ea8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c);
    poVar2 = LogMessage::stream(&local_ea8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"177777U\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ea8);
  }
  if (local_822 != 0xffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1028,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3c);
    poVar2 = LogMessage::stream((LogMessage *)local_1028);
    std::operator<<(poVar2,"Check failed: (v) == (0177777U)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1028);
  }
  StringPiece::StringPiece(&local_1040,"17777777777");
  RE2::RE2(&local_1120,"([0-7]+)[uUlL]*");
  local_1130 = RE2::Octal(&local_102c);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_1040,&local_1120,&local_1130);
  RE2::~RE2(&local_1120);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_12b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d);
    poVar2 = LogMessage::stream(&local_12b0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"17777777777\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_12b0);
  }
  if (local_102c != 0x7fffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1430,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d);
    poVar2 = LogMessage::stream(&local_1430);
    std::operator<<(poVar2,"Check failed: (v) == (017777777777)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1430);
  }
  StringPiece::StringPiece(&local_1440,"017777777777");
  RE2::RE2(&local_1520,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1530 = RE2::CRadix(&local_102c);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_1440,&local_1520,&local_1530);
  RE2::~RE2(&local_1520);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_16b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d);
    poVar2 = LogMessage::stream(&local_16b0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"17777777777\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_16b0);
  }
  if (local_102c != 0x7fffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_1830,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3d);
    poVar2 = LogMessage::stream((LogMessage *)local_1830);
    std::operator<<(poVar2,"Check failed: (v) == (017777777777)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1830);
  }
  StringPiece::StringPiece(&local_1848,"37777777777U");
  RE2::RE2(&local_1928,"([0-7]+)[uUlL]*");
  local_1938 = RE2::Octal(&local_1834);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_1848,&local_1928,&local_1938);
  RE2::~RE2(&local_1928);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1ab8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e);
    poVar2 = LogMessage::stream(&local_1ab8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"37777777777U\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1ab8);
  }
  if (local_1834 != 0xffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1c38,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e);
    poVar2 = LogMessage::stream(&local_1c38);
    std::operator<<(poVar2,"Check failed: (v) == (037777777777U)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c38);
  }
  StringPiece::StringPiece(&local_1c48,"037777777777U");
  RE2::RE2(&local_1d28,"([0-9a-fA-FxX]+)[uUlL]*");
  local_1d38 = RE2::CRadix(&local_1834);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_1c48,&local_1d28,&local_1d38);
  RE2::~RE2(&local_1d28);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1eb8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e);
    poVar2 = LogMessage::stream(&local_1eb8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"37777777777U\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1eb8);
  }
  if (local_1834 != 0xffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&v_4,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3e);
    poVar2 = LogMessage::stream((LogMessage *)&v_4);
    std::operator<<(poVar2,"Check failed: (v) == (037777777777U)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&v_4);
  }
  StringPiece::StringPiece(&local_2050,"17777777777L");
  RE2::RE2(&local_2130,"([0-7]+)[uUlL]*");
  local_2140 = RE2::Octal(&local_2040);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_2050,&local_2130,&local_2140);
  RE2::~RE2(&local_2130);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_22c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f);
    poVar2 = LogMessage::stream(&local_22c0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"17777777777L\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_22c0);
  }
  if (local_2040 != 0x7fffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2440,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f);
    poVar2 = LogMessage::stream(&local_2440);
    std::operator<<(poVar2,"Check failed: (v) == (017777777777L)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2440);
  }
  StringPiece::StringPiece(&local_2450,"017777777777L");
  RE2::RE2(&local_2530,"([0-9a-fA-FxX]+)[uUlL]*");
  local_2540 = RE2::CRadix(&local_2040);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_2450,&local_2530,&local_2540);
  RE2::~RE2(&local_2530);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_26c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f);
    poVar2 = LogMessage::stream(&local_26c0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"17777777777L\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_26c0);
  }
  if (local_2040 != 0x7fffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&v_5,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x3f);
    poVar2 = LogMessage::stream((LogMessage *)&v_5);
    std::operator<<(poVar2,"Check failed: (v) == (017777777777L)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&v_5);
  }
  StringPiece::StringPiece(&local_2858,"37777777777UL");
  RE2::RE2(&local_2938,"([0-7]+)[uUlL]*");
  local_2948 = RE2::Octal(&local_2848);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_2858,&local_2938,&local_2948);
  RE2::~RE2(&local_2938);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2ac8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40);
    poVar2 = LogMessage::stream(&local_2ac8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"37777777777UL\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2ac8);
  }
  if (local_2848 != 0xffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2c48,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40);
    poVar2 = LogMessage::stream(&local_2c48);
    std::operator<<(poVar2,"Check failed: (v) == (037777777777UL)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c48);
  }
  StringPiece::StringPiece(&local_2c58,"037777777777UL");
  RE2::RE2(&local_2d38,"([0-9a-fA-FxX]+)[uUlL]*");
  local_2d48 = RE2::CRadix(&local_2848);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_2c58,&local_2d38,&local_2d48);
  RE2::~RE2(&local_2d38);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2ec8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40);
    poVar2 = LogMessage::stream(&local_2ec8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"37777777777UL\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2ec8);
  }
  if (local_2848 != 0xffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&v_6,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x40);
    poVar2 = LogMessage::stream((LogMessage *)&v_6);
    std::operator<<(poVar2,"Check failed: (v) == (037777777777UL)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&v_6);
  }
  StringPiece::StringPiece(&local_3060,"777777777777777777777LL");
  RE2::RE2(&local_3140,"([0-7]+)[uUlL]*");
  local_3150 = RE2::Octal(&local_3050);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_3060,&local_3140,&local_3150);
  RE2::~RE2(&local_3140);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_32d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41);
    poVar2 = LogMessage::stream(&local_32d0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"777777777777777777777LL\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_32d0);
  }
  if (local_3050 != 0x7fffffffffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3450,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41);
    poVar2 = LogMessage::stream(&local_3450);
    std::operator<<(poVar2,"Check failed: (v) == (0777777777777777777777LL)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3450);
  }
  StringPiece::StringPiece(&local_3460,"0777777777777777777777LL");
  RE2::RE2(&local_3540,"([0-9a-fA-FxX]+)[uUlL]*");
  local_3550 = RE2::CRadix(&local_3050);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_3460,&local_3540,&local_3550);
  RE2::~RE2(&local_3540);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_36d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41);
    poVar2 = LogMessage::stream(&local_36d0);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"777777777777777777777LL\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_36d0);
  }
  if (local_3050 != 0x7fffffffffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&v_7,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x41);
    poVar2 = LogMessage::stream((LogMessage *)&v_7);
    std::operator<<(poVar2,"Check failed: (v) == (0777777777777777777777LL)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&v_7);
  }
  StringPiece::StringPiece(&local_3868,"1777777777777777777777ULL");
  RE2::RE2(&local_3948,"([0-7]+)[uUlL]*");
  local_3958 = RE2::Octal(&local_3858);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_3868,&local_3948,&local_3958);
  RE2::~RE2(&local_3948);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3ad8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42);
    poVar2 = LogMessage::stream(&local_3ad8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"1777777777777777777777ULL\", \"([0-7]+)[uUlL]*\", RE2::Octal(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3ad8);
  }
  if (local_3858 != 0xffffffffffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3c58,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42);
    poVar2 = LogMessage::stream(&local_3c58);
    std::operator<<(poVar2,"Check failed: (v) == (01777777777777777777777ULL)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3c58);
  }
  StringPiece::StringPiece(&local_3c68,"01777777777777777777777ULL");
  RE2::RE2(&local_3d48,"([0-9a-fA-FxX]+)[uUlL]*");
  local_3d58 = RE2::CRadix(&local_3858);
  bVar1 = RE2::FullMatch<re2::RE2::Arg>(&local_3c68,&local_3d48,&local_3d58);
  RE2::~RE2(&local_3d48);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_3ed8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42);
    poVar2 = LogMessage::stream(&local_3ed8);
    std::operator<<(poVar2,
                    "Check failed: RE2::FullMatch(\"0\" \"1777777777777777777777ULL\", \"([0-9a-fA-FxX]+)[uUlL]*\", RE2::CRadix(&v))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3ed8);
  }
  if (local_3858 != 0xffffffffffffffff) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4058,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x42);
    poVar2 = LogMessage::stream(&local_4058);
    std::operator<<(poVar2,"Check failed: (v) == (01777777777777777777777ULL)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4058);
  }
  return;
}

Assistant:

TEST(RE2, OctalTests) {
  VLOG(1) << "octal tests";

#define CHECK_OCTAL(type, value) \
  do { \
    type v; \
    CHECK(RE2::FullMatch(#value, "([0-7]+)[uUlL]*", RE2::Octal(&v))); \
    CHECK_EQ(v, 0 ## value); \
    CHECK(RE2::FullMatch("0" #value, "([0-9a-fA-FxX]+)[uUlL]*", RE2::CRadix(&v))); \
    CHECK_EQ(v, 0 ## value); \
  } while(0)

  CHECK_OCTAL(short,              77777);
  CHECK_OCTAL(unsigned short,     177777U);
  CHECK_OCTAL(int,                17777777777);
  CHECK_OCTAL(unsigned int,       37777777777U);
  CHECK_OCTAL(long,               17777777777L);
  CHECK_OCTAL(unsigned long,      37777777777UL);
  CHECK_OCTAL(long long,          777777777777777777777LL);
  CHECK_OCTAL(unsigned long long, 1777777777777777777777ULL);

#undef CHECK_OCTAL
}

TEST(RE2, DecimalTests) {
  VLOG(1) << "decimal tests";

#define CHECK_DECIMAL(type, value) \
  do { \
    type v; \
    CHECK(RE2::FullMatch(#value, "(-?[0-9]+)[uUlL]*", &v)); \
    CHECK_EQ(v, value); \
    CHECK(RE2::FullMatch(#value, "(-?[0-9a-fA-FxX]+)[uUlL]*", RE2::CRadix(&v))); \
    CHECK_EQ(v, value); \
  } while(0)

  CHECK_DECIMAL(short,              -1);
  CHECK_DECIMAL(unsigned short,     9999);
  CHECK_DECIMAL(int,                -1000);
  CHECK_DECIMAL(unsigned int,       12345U);
  CHECK_DECIMAL(long,               -10000000L);
  CHECK_DECIMAL(unsigned long,      3083324652U);
  CHECK_DECIMAL(long long,          -100000000000000LL);
  CHECK_DECIMAL(unsigned long long, 1234567890987654321ULL);

#undef CHECK_DECIMAL
}